

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_lib.c
# Opt level: O0

int OSSL_ENCODER_to_data(OSSL_ENCODER_CTX *ctx,uchar **pdata,size_t *pdata_len)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  BIO_METHOD *type;
  BIO *bp;
  long lVar4;
  ulong *in_RDX;
  ulong *in_RSI;
  int ret;
  BUF_MEM *buf;
  BIO *out;
  uint local_34;
  ulong *func;
  undefined8 in_stack_ffffffffffffffd8;
  uint local_4;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  func = (ulong *)0x0;
  local_34 = 0;
  if (in_RDX == (ulong *)0x0) {
    ERR_new();
    ERR_set_debug((char *)in_RDX,iVar3,(char *)func);
    ERR_set_error(0x3b,0xc0102,(char *)0x0);
    local_4 = 0;
  }
  else {
    type = BIO_s_mem();
    bp = BIO_new(type);
    if (((bp != (BIO *)0x0) &&
        (iVar3 = OSSL_ENCODER_to_bio((OSSL_ENCODER_CTX *)pdata_len,out), iVar3 != 0)) &&
       (lVar4 = BIO_ctrl(bp,0x73,0,&stack0xffffffffffffffd0), 0 < lVar4)) {
      local_34 = 1;
      if ((in_RSI == (ulong *)0x0) || (*in_RSI == 0)) {
        *in_RDX = *func;
      }
      else {
        uVar1 = *in_RDX;
        uVar2 = *func;
        if (uVar2 <= uVar1) {
          *in_RDX = *in_RDX - *func;
        }
        local_34 = (uint)(uVar2 <= uVar1);
      }
      if ((local_34 != 0) && (in_RSI != (ulong *)0x0)) {
        if (*in_RSI == 0) {
          *in_RSI = func[1];
          func[1] = 0;
        }
        else {
          memcpy((void *)*in_RSI,(void *)func[1],*func);
          *in_RSI = *func + *in_RSI;
        }
      }
    }
    BIO_free(bp);
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

int OSSL_ENCODER_to_data(OSSL_ENCODER_CTX *ctx, unsigned char **pdata,
                         size_t *pdata_len)
{
    BIO *out;
    BUF_MEM *buf = NULL;
    int ret = 0;

    if (pdata_len == NULL) {
        ERR_raise(ERR_LIB_OSSL_ENCODER, ERR_R_PASSED_NULL_PARAMETER);
        return 0;
    }

    out = BIO_new(BIO_s_mem());

    if (out != NULL
        && OSSL_ENCODER_to_bio(ctx, out)
        && BIO_get_mem_ptr(out, &buf) > 0) {
        ret = 1; /* Hope for the best. A too small buffer will clear this */

        if (pdata != NULL && *pdata != NULL) {
            if (*pdata_len < buf->length)
                /*
                 * It's tempting to do |*pdata_len = (size_t)buf->length|
                 * However, it's believed to be confusing more than helpful,
                 * so we don't.
                 */
                ret = 0;
            else
                *pdata_len -= buf->length;
        } else {
            /* The buffer with the right size is already allocated for us */
            *pdata_len = (size_t)buf->length;
        }

        if (ret) {
            if (pdata != NULL) {
                if (*pdata != NULL) {
                    memcpy(*pdata, buf->data, buf->length);
                    *pdata += buf->length;
                } else {
                    /* In this case, we steal the data from BIO_s_mem() */
                    *pdata = (unsigned char *)buf->data;
                    buf->data = NULL;
                }
            }
        }
    }
    BIO_free(out);
    return ret;
}